

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O0

void fekete_subrule(int rule,int suborder_num,double *suborder_xyz,double *suborder_w)

{
  ostream *poVar1;
  int local_24;
  int s;
  double *suborder_w_local;
  double *suborder_xyz_local;
  int suborder_num_local;
  int rule_local;
  
  if (rule == 1) {
    fekete_subrule_1(suborder_num,suborder_xyz,suborder_w);
  }
  else if (rule == 2) {
    fekete_subrule_2(suborder_num,suborder_xyz,suborder_w);
  }
  else if (rule == 3) {
    fekete_subrule_3(suborder_num,suborder_xyz,suborder_w);
  }
  else if (rule == 4) {
    fekete_subrule_4(suborder_num,suborder_xyz,suborder_w);
  }
  else if (rule == 5) {
    fekete_subrule_5(suborder_num,suborder_xyz,suborder_w);
  }
  else if (rule == 6) {
    fekete_subrule_6(suborder_num,suborder_xyz,suborder_w);
  }
  else {
    if (rule != 7) {
      std::operator<<((ostream *)&std::cerr,"\n");
      std::operator<<((ostream *)&std::cerr,"FEKETE_SUBRULE - Fatal error!\n");
      poVar1 = std::operator<<((ostream *)&std::cerr,"  Illegal RULE = ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,rule);
      std::operator<<(poVar1,"\n");
      exit(1);
    }
    fekete_subrule_7(suborder_num,suborder_xyz,suborder_w);
  }
  for (local_24 = 0; local_24 < suborder_num; local_24 = local_24 + 1) {
    suborder_w[local_24] = suborder_w[local_24] * 0.5;
  }
  return;
}

Assistant:

void fekete_subrule ( int rule, int suborder_num, double suborder_xyz[], 
  double suborder_w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_SUBRULE returns a compressed Fekete rule.
//
//  Discussion:
//
//    The listed weights are twice what we want...since we want them
//    to sum to 1/2, reflecting the area of a unit triangle.  So we
//    simple halve the values before exiting this routine.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 January 2007
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int RULE, the index of the rule.
//
//    Input, int SUBORDER_NUM, the number of suborders of the rule.
//
//    Output, double SUBORDER_XYZ[3*SUBORDER_NUM],
//    the barycentric coordinates of the abscissas.
//
//    Output, double SUBORDER_W[SUBORDER_NUM], the suborder weights.
//
{
  int s;

  if ( rule == 1 )
  {
    fekete_subrule_1 ( suborder_num, suborder_xyz, suborder_w );
  }
  else if ( rule == 2 )
  {
    fekete_subrule_2 ( suborder_num, suborder_xyz, suborder_w );
  }
  else if ( rule == 3 )
  {
    fekete_subrule_3 ( suborder_num, suborder_xyz, suborder_w );
  }
  else if ( rule == 4 )
  {
    fekete_subrule_4 ( suborder_num, suborder_xyz, suborder_w );
  }
  else if ( rule == 5 )
  {
    fekete_subrule_5 ( suborder_num, suborder_xyz, suborder_w );
  }
  else if ( rule == 6 )
  {
    fekete_subrule_6 ( suborder_num, suborder_xyz, suborder_w );
  }
  else if ( rule == 7 )
  {
    fekete_subrule_7 ( suborder_num, suborder_xyz, suborder_w );
  }
  else
  {
    std::cerr << "\n";
    std::cerr << "FEKETE_SUBRULE - Fatal error!\n";
    std::cerr << "  Illegal RULE = " << rule << "\n";
    exit ( 1 );
  }

  for ( s = 0; s < suborder_num; s++ )
  {
    suborder_w[s] = 0.5 * suborder_w[s];
  }

  return;
}